

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

void __thiscall
HPack::huffman_encode_string(HPack *this,QByteArrayView inputData,BitOStream *outputStream)

{
  ulong uVar1;
  quint64 qVar2;
  uint uVar3;
  BitOStream *this_00;
  uint uVar4;
  ulong uVar5;
  
  this_00 = (BitOStream *)inputData.m_data;
  if (0 < (int)(uint)this) {
    uVar5 = 0;
    do {
      uVar1 = (ulong)*(byte *)(inputData.m_size + uVar5);
      uVar3 = *(uint *)((anonymous_namespace)::staticHuffmanCodeTable + uVar1 * 0xc + 8);
      uVar4 = *(uint *)((anonymous_namespace)::staticHuffmanCodeTable + uVar1 * 0xc + 4) >>
              (-(char)uVar3 & 0x1fU);
      if (uVar3 < 0x19) {
        if (0x10 < uVar3) goto LAB_001e21f1;
        if (8 < uVar3) goto LAB_001e220c;
      }
      else {
        BitOStream::writeBits(this_00,(uchar)(uVar4 >> 0x18),(char)uVar3 + 0xe8);
        uVar3 = 0x18;
LAB_001e21f1:
        BitOStream::writeBits(this_00,(uchar)(uVar4 >> 0x10),(char)uVar3 + 0xf0);
        uVar3 = 0x10;
LAB_001e220c:
        BitOStream::writeBits(this_00,(uchar)(uVar4 >> 8),(char)uVar3 + 0xf8);
        uVar3 = 8;
      }
      BitOStream::writeBits(this_00,(uchar)uVar4,(quint8)uVar3);
      uVar5 = uVar5 + 1;
    } while (((uint)this & 0x7fffffff) != uVar5);
  }
  qVar2 = BitOStream::bitLength(this_00);
  if ((qVar2 & 7) == 0) {
    return;
  }
  qVar2 = BitOStream::bitLength(this_00);
  BitOStream::writeBits(this_00,0xff,'\b' - ((byte)qVar2 & 7));
  return;
}

Assistant:

void huffman_encode_string(QByteArrayView inputData, BitOStream &outputStream)
{
    for (int i = 0, e = inputData.size(); i < e; ++i) {
        const auto value = uchar(inputData[i]);
        write_huffman_code(outputStream, staticHuffmanCodeTable[value]);
    }

    // Pad bits ...
    if (outputStream.bitLength() % 8)
        outputStream.writeBits(0xff, 8 - outputStream.bitLength() % 8);
}